

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O1

unsigned_long
getU<unsigned_long>(uint64_t *offset_ptr,DataExtractor *de,bool isLittleEndian,char *Data,Error *Err
                   )

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ErrorInfoBase *pEVar4;
  
  if (Err == (Error *)0x0) {
LAB_00d4f5ab:
    uVar2 = *offset_ptr;
    if ((uVar2 < 0xfffffffffffffff8) && (uVar2 + 7 < (de->Data).Length)) {
      uVar1 = *(ulong *)(Data + uVar2);
      uVar3 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      if (isLittleEndian) {
        uVar3 = uVar1;
      }
      *offset_ptr = uVar2 + 8;
      goto LAB_00d4f5e1;
    }
    unexpectedEndReached(Err);
  }
  else {
    uVar2 = (ulong)Err->Payload & 0xfffffffffffffffe;
    Err->Payload = (ErrorInfoBase *)(uVar2 != 0 | uVar2);
    if (uVar2 == 0) goto LAB_00d4f5ab;
  }
  uVar3 = 0;
LAB_00d4f5e1:
  if (Err != (Error *)0x0) {
    uVar2 = (ulong)Err->Payload & 0xfffffffffffffffe;
    pEVar4 = (ErrorInfoBase *)0x1;
    if (uVar2 != 0) {
      pEVar4 = (ErrorInfoBase *)(uVar2 != 0 | uVar2);
    }
    Err->Payload = pEVar4;
  }
  return uVar3;
}

Assistant:

static T getU(uint64_t *offset_ptr, const DataExtractor *de,
              bool isLittleEndian, const char *Data, llvm::Error *Err) {
  ErrorAsOutParameter ErrAsOut(Err);
  T val = 0;
  if (isError(Err))
    return val;

  uint64_t offset = *offset_ptr;
  if (!de->isValidOffsetForDataOfSize(offset, sizeof(T))) {
    unexpectedEndReached(Err);
    return val;
  }
  std::memcpy(&val, &Data[offset], sizeof(val));
  if (sys::IsLittleEndianHost != isLittleEndian)
    sys::swapByteOrder(val);

  // Advance the offset
  *offset_ptr += sizeof(val);
  return val;
}